

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O3

int ON_wString::MapStringOrdinal
              (ON_StringMapOrdinalType map_type,wchar_t *string,int element_count,
              wchar_t *mapped_string,int mapped_string_capacity)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  int iVar3;
  uint uVar4;
  
  if (mapped_string_capacity == 0) {
    uVar4 = element_count;
    if (element_count < 0) {
      iVar3 = Length(string);
      uVar4 = 0;
      if (-1 < iVar3) {
        uVar4 = iVar3 + 1;
      }
    }
  }
  else {
    uVar4 = 0;
    if (0 < mapped_string_capacity && mapped_string != (wchar_t *)0x0) {
      if (string != mapped_string) {
        *mapped_string = L'\0';
      }
      if (((-1 < element_count) || (element_count = Length(string), -1 < element_count)) &&
         ((uint)element_count <= (uint)mapped_string_capacity)) {
        if (element_count != 0) {
          pwVar1 = string + (uint)element_count;
          do {
            wVar2 = *string;
            string = string + 1;
            wVar2 = MapCodePointOrdinal(wVar2,0xffff,map_type);
            *mapped_string = wVar2;
            mapped_string = mapped_string + 1;
          } while (string < pwVar1);
        }
        uVar4 = element_count;
        if (element_count < mapped_string_capacity) {
          *mapped_string = L'\0';
        }
      }
    }
  }
  return uVar4;
}

Assistant:

int ON_wString::MapStringOrdinal(
  ON_StringMapOrdinalType map_type,
  const wchar_t* string,
  int element_count,
  wchar_t* mapped_string,
  int mapped_string_capacity
  )
{
  if (0 != mapped_string_capacity)
  {
    if (nullptr == mapped_string || mapped_string_capacity <= 0)
      return 0;

    if (string != mapped_string)
      mapped_string[0] = 0;
  }

  if (element_count < 0)
  {
    element_count = ON_wString::Length(string);
    if (element_count < 0)
      return 0;
    if ( 0 == mapped_string_capacity )
      return element_count+1; // +1 for null terminator
  }
  else if ( 0 == mapped_string_capacity )
    return element_count; // no +1 here

  if ( element_count > mapped_string_capacity )
    return 0;

  const wchar_t* s1 = string + element_count;
  while (string < s1)
    *mapped_string++ = ON_wString::MapCharacterOrdinal(map_type,*string++);

  if ( element_count < mapped_string_capacity )
    *mapped_string = 0;

  return element_count;
}